

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringpiece.cc
# Opt level: O1

void google::protobuf::StringPiece::LogFatalSizeTooBig(size_t size,char *details)

{
  LogMessage *pLVar1;
  LogFinisher local_51;
  LogMessage local_50;
  
  internal::LogMessage::LogMessage
            (&local_50,LOGLEVEL_DFATAL,
             "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/stubs/stringpiece.cc"
             ,0x2f);
  pLVar1 = internal::LogMessage::operator<<(&local_50,"size too big: ");
  pLVar1 = internal::LogMessage::operator<<(pLVar1,size);
  pLVar1 = internal::LogMessage::operator<<(pLVar1," details: ");
  pLVar1 = internal::LogMessage::operator<<(pLVar1,details);
  internal::LogFinisher::operator=(&local_51,pLVar1);
  internal::LogMessage::~LogMessage(&local_50);
  return;
}

Assistant:

void StringPiece::LogFatalSizeTooBig(size_t size, const char* details) {
  GOOGLE_LOG(FATAL) << "size too big: " << size << " details: " << details;
}